

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipp.h
# Opt level: O2

parameter * __thiscall
clipp::detail::action_provider<clipp::parameter>::set<main::__0,main::__0>
          (action_provider<clipp::parameter> *this,anon_enum_32 *t,anon_enum_32 *v)

{
  parameter *ppVar1;
  _Any_data local_28;
  code *local_18;
  code *local_10;
  
  local_28._12_4_ = 0;
  local_28._8_4_ = *v;
  local_10 = std::
             _Function_handler<void_(),_clipp::detail::assign_value<(unnamed_enum_at_/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/src/tool/main.cpp:43:2),_(unnamed_enum_at_/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/src/tool/main.cpp:43:2)>_>
             ::_M_invoke;
  local_18 = std::
             _Function_handler<void_(),_clipp::detail::assign_value<(unnamed_enum_at_/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/src/tool/main.cpp:43:2),_(unnamed_enum_at_/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/src/tool/main.cpp:43:2)>_>
             ::_M_manager;
  local_28._M_unused._M_object = t;
  ppVar1 = call(this,(simple_action *)&local_28);
  std::_Function_base::~_Function_base((_Function_base *)&local_28);
  return ppVar1;
}

Assistant:

Derived&
    set(Target& t, Value&& v) {
        return call(clipp::set(t, std::forward<Value>(v)));
    }